

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O3

IOTHUB_REGISTRYMANAGER_RESULT
IoTHubRegistryManager_UpdateModule
          (IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle,
          IOTHUB_REGISTRY_MODULE_UPDATE *moduleUpdate)

{
  IOTHUB_REGISTRYMANAGER_RESULT IVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  IOTHUB_REGISTRY_DEVICE_OR_MODULE_UPDATE local_48;
  
  if (registryManagerHandle == (IOTHUB_REGISTRYMANAGER_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    pcVar4 = "Input parameter cannot be NULL";
    IVar1 = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    iVar3 = 0x7c3;
  }
  else if ((moduleUpdate == (IOTHUB_REGISTRY_MODULE_UPDATE *)0x0) ||
          (local_48.moduleId = moduleUpdate->moduleId, local_48.moduleId == (char *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    pcVar4 = "moduleId cannot be NULL";
    IVar1 = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    iVar3 = 0x7c8;
  }
  else {
    if (moduleUpdate->version == 1) {
      local_48.iotEdge_capable = false;
      local_48._41_7_ = 0;
      local_48.type = IOTHUB_REGISTRYMANAGER_MODEL_TYPE_MODULE;
      local_48._4_4_ = 0;
      local_48.deviceId = moduleUpdate->deviceId;
      local_48.primaryKey = moduleUpdate->primaryKey;
      local_48.secondaryKey = moduleUpdate->secondaryKey;
      local_48.status = moduleUpdate->status;
      local_48.authMethod = moduleUpdate->authMethod;
      local_48.managedBy = moduleUpdate->managedBy;
      IVar1 = IoTHubRegistryManager_UpdateDeviceOrModule(registryManagerHandle,&local_48);
      return IVar1;
    }
    p_Var2 = xlogging_get_log_function();
    IVar1 = IOTHUB_REGISTRYMANAGER_INVALID_VERSION;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return IOTHUB_REGISTRYMANAGER_INVALID_VERSION;
    }
    pcVar4 = "moduleUpdate must have valid version";
    iVar3 = 0x7cd;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
            ,"IoTHubRegistryManager_UpdateModule",iVar3,1,pcVar4);
  return IVar1;
}

Assistant:

IOTHUB_REGISTRYMANAGER_RESULT IoTHubRegistryManager_UpdateModule(IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle, IOTHUB_REGISTRY_MODULE_UPDATE* moduleUpdate)
{
    IOTHUB_REGISTRYMANAGER_RESULT result;

    if (registryManagerHandle == NULL)
    {
        LogError("Input parameter cannot be NULL");
        result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else if ((moduleUpdate == NULL) || (moduleUpdate->moduleId == NULL))
    {
        LogError("moduleId cannot be NULL");
        result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else if (moduleUpdate->version < IOTHUB_REGISTRY_MODULE_UPDATE_VERSION_1 || moduleUpdate->version > IOTHUB_REGISTRY_MODULE_UPDATE_VERSION_LATEST)
    {
        LogError("moduleUpdate must have valid version");
        result = IOTHUB_REGISTRYMANAGER_INVALID_VERSION;
    }
    else
    {
        IOTHUB_REGISTRY_DEVICE_OR_MODULE_UPDATE deviceOrModuleUpdate;
        memset(&deviceOrModuleUpdate, 0, sizeof(deviceOrModuleUpdate));

        //Convert to generic update struct
        deviceOrModuleUpdate.type = IOTHUB_REGISTRYMANAGER_MODEL_TYPE_MODULE;
        if (moduleUpdate-> version >= IOTHUB_REGISTRY_MODULE_UPDATE_VERSION_1)
        {
            deviceOrModuleUpdate.deviceId = moduleUpdate->deviceId;
            deviceOrModuleUpdate.primaryKey = moduleUpdate->primaryKey;
            deviceOrModuleUpdate.secondaryKey = moduleUpdate->secondaryKey;
            deviceOrModuleUpdate.status = moduleUpdate->status;
            deviceOrModuleUpdate.authMethod = moduleUpdate->authMethod;
            deviceOrModuleUpdate.moduleId = moduleUpdate->moduleId;
            deviceOrModuleUpdate.managedBy = moduleUpdate->managedBy;
        }

        result = IoTHubRegistryManager_UpdateDeviceOrModule(registryManagerHandle, &deviceOrModuleUpdate);
    }

    return result;
}